

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O0

void __thiscall
CHog::initialHist(CHog *this,int _imgWidth,int _imgHeight,int _imgChannel,int _windowWidth,
                 int _windowHeight,int _numOriHalf,int _numOriFull,int _cellSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ostream *this_00;
  ulong uVar10;
  histCell **pphVar11;
  histCell *phVar12;
  double *pdVar13;
  int **ppiVar14;
  int *piVar15;
  int local_30;
  int local_2c;
  int y_1;
  int x;
  int y;
  int _windowHeight_local;
  int _windowWidth_local;
  int _imgChannel_local;
  int _imgHeight_local;
  int _imgWidth_local;
  CHog *this_local;
  
  if ((_windowWidth % _cellSize == 0) && (_windowHeight % _cellSize == 0)) {
    this->cellSize = _cellSize;
    this->windowHeight = _windowHeight;
    this->windowWidth = _windowWidth;
    this->numCellX = _windowWidth / this->cellSize;
    this->numCellY = _windowHeight / this->cellSize;
    this->histSizeX = this->numCellX + 2;
    this->histSizeY = this->numCellY + 2;
    this->imgWidth = _imgWidth;
    this->imgHeight = _imgHeight;
    this->imgChannel = _imgChannel;
    this->widthStep = this->imgWidth * this->imgChannel;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->histSizeY;
    uVar10 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pphVar11 = (histCell **)operator_new__(uVar10);
    this->hist = pphVar11;
    for (y_1 = 0; y_1 < this->histSizeY; y_1 = y_1 + 1) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)this->histSizeX;
      uVar10 = SUB168(auVar2 * ZEXT816(0x30),0);
      if (SUB168(auVar2 * ZEXT816(0x30),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      phVar12 = (histCell *)operator_new__(uVar10);
      this->hist[y_1] = phVar12;
      for (local_2c = 0; local_2c < this->histSizeX; local_2c = local_2c + 1) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (long)_numOriFull;
        uVar10 = SUB168(auVar3 * ZEXT816(8),0);
        if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        pdVar13 = (double *)operator_new__(uVar10);
        this->hist[y_1][local_2c].cellBinsFull = pdVar13;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (long)_numOriHalf;
        uVar10 = SUB168(auVar4 * ZEXT816(8),0);
        if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        pdVar13 = (double *)operator_new__(uVar10);
        this->hist[y_1][local_2c].cellBinsHalf = pdVar13;
        this->hist[y_1][local_2c].dim = _numOriFull + _numOriHalf + 4;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (long)this->hist[y_1][local_2c].dim;
        uVar10 = SUB168(auVar5 * ZEXT816(8),0);
        if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        pdVar13 = (double *)operator_new__(uVar10);
        this->hist[y_1][local_2c].feat = pdVar13;
        this->hist[y_1][local_2c].numOriFull = _numOriFull;
        this->hist[y_1][local_2c].numOriHalf = _numOriHalf;
        this->hist[y_1][local_2c].normFactorHalf = 0.0;
        memset(this->hist[y_1][local_2c].cellBinsFull,0,
               (long)this->hist[y_1][local_2c].numOriFull << 3);
        memset(this->hist[y_1][local_2c].cellBinsHalf,0,
               (long)this->hist[y_1][local_2c].numOriHalf << 3);
        memset(this->hist[y_1][local_2c].feat,0,(long)this->hist[y_1][local_2c].dim << 3);
      }
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)this->imgHeight;
    uVar10 = SUB168(auVar6 * ZEXT816(8),0);
    if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    ppiVar14 = (int **)operator_new__(uVar10);
    this->dx = ppiVar14;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)this->imgHeight;
    uVar10 = SUB168(auVar7 * ZEXT816(8),0);
    if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    ppiVar14 = (int **)operator_new__(uVar10);
    this->dy = ppiVar14;
    for (local_30 = 0; local_30 < this->imgHeight; local_30 = local_30 + 1) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (long)this->imgWidth;
      uVar10 = SUB168(auVar8 * ZEXT816(4),0);
      if (SUB168(auVar8 * ZEXT816(4),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      piVar15 = (int *)operator_new__(uVar10);
      this->dx[local_30] = piVar15;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (long)this->imgWidth;
      uVar10 = SUB168(auVar9 * ZEXT816(4),0);
      if (SUB168(auVar9 * ZEXT816(4),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      piVar15 = (int *)operator_new__(uVar10);
      this->dy[local_30] = piVar15;
      memset(this->dx[local_30],0,(long)this->imgWidth << 2);
      memset(this->dy[local_30],0,(long)this->imgWidth << 2);
    }
    return;
  }
  this_00 = std::operator<<((ostream *)&std::cout,"image size is not N*cellSize");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

void CHog::initialHist(int _imgWidth,
                       int _imgHeight,
                       int _imgChannel,
                       int _windowWidth,
                       int _windowHeight,
                       int _numOriHalf, //方向量化个数
                       int _numOriFull,
                       int _cellSize) //cell尺寸
{
    //cout<<"hog hist intializing"<<endl;
    if(_windowWidth%_cellSize!=0 || _windowHeight%_cellSize!=0)  //判断图像尺寸是否是cell尺寸的整倍数
    {
        cout<<"image size is not N*cellSize"<<endl;
        exit(0);
    }
    cellSize = _cellSize;
    windowHeight = _windowHeight;
    windowWidth = _windowWidth;
    numCellX = _windowWidth/cellSize;
    numCellY = _windowHeight/cellSize;
    histSizeX = numCellX + 2;
    histSizeY = numCellY + 2;
    imgWidth = _imgWidth;
    imgHeight = _imgHeight;
    imgChannel = _imgChannel;
    widthStep = imgWidth*imgChannel;
    //为直方图分配空间，并赋初始值0//
    hist = new histCell*[histSizeY];
    for(int y=0; y<histSizeY; y++)
    {
        hist[y] = new histCell[histSizeX];
        for(int x=0; x<histSizeX; x++)
        {
            hist[y][x].cellBinsFull = new double[_numOriFull];  //为一个cell进行空间分配
            hist[y][x].cellBinsHalf = new double[_numOriHalf];
            hist[y][x].dim = 4 + (_numOriFull+_numOriHalf);
            hist[y][x].feat = new double[hist[y][x].dim];
            hist[y][x].numOriFull = _numOriFull;
            hist[y][x].numOriHalf = _numOriHalf;
            //hist[y][x].normFactorFull = 0.;
            hist[y][x].normFactorHalf = 0.;
            memset(hist[y][x].cellBinsFull, 0, hist[y][x].numOriFull*sizeof(double));  //将直方图初始化为全0
            memset(hist[y][x].cellBinsHalf, 0, hist[y][x].numOriHalf*sizeof(double));
            memset(hist[y][x].feat, 0, hist[y][x].dim*sizeof(double));
        }
    }
    //为微分图像分配空间,并赋初始值0//
    dx = new int*[imgHeight];
    dy = new int*[imgHeight];
    for(int y=0; y<imgHeight; y++)
    {
        dx[y] = new int[imgWidth];
        dy[y] = new int[imgWidth];
        memset(dx[y], 0, imgWidth*sizeof(int));
        memset(dy[y], 0, imgWidth*sizeof(int));
    }
    //cout<<"hog hist intialized"<<endl;
}